

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

void __thiscall inja::Bytecode::Bytecode(Bytecode *this,Op op,json *value,uint flags)

{
  this->op = op;
  *(uint *)&this->field_0x4 = flags << 0x1e;
  (this->value).m_type = value->m_type;
  (this->value).m_value = value->m_value;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(value);
  value->m_type = null;
  (value->m_value).object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant(&this->value);
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit Bytecode(Op op, json&& value, unsigned int flags)
		: op(op), args(0), flags(flags), value(std::move(value)) {}